

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS
ref_fixture_tet_brick_args_grid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,
          REF_DBL y1,REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n)

{
  REF_DBL *pRVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  double dVar10;
  uint uVar11;
  double dVar12;
  REF_NODE ref_node;
  ulong uVar13;
  REF_DBL RVar14;
  char *pcVar15;
  ulong uVar16;
  uint uVar17;
  REF_GRID_conflict pRVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  REF_INT cell;
  REF_INT tet [4];
  REF_INT node;
  REF_INT local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  undefined4 local_ec;
  double local_e0;
  REF_GRID_conflict local_d8;
  double local_d0;
  REF_DBL local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  REF_DBL local_98;
  uint local_90;
  uint local_8c;
  ulong local_88;
  REF_NODE local_80;
  double local_78;
  uint local_6c;
  ulong local_68;
  uint local_5c;
  undefined8 local_58;
  double local_50;
  double local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar7 = (ulong)(uint)l;
  local_e0 = x1;
  local_d0 = x0;
  local_80 = (REF_NODE)z1;
  local_78 = y1;
  local_50 = z0;
  local_48 = y0;
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 == 0) {
    pRVar18 = *ref_grid_ptr;
    ref_node = pRVar18->node;
    if (pRVar18->mpi->id == 0) {
      uVar2 = n - 1;
      uVar16 = (ulong)uVar2;
      uVar20 = (ulong)(uint)m;
      local_d8 = pRVar18;
      local_b0 = (ulong)(uint)n;
      if (n < 1) {
LAB_00138e0d:
        local_88 = (ulong)(uint)((int)uVar20 * (int)uVar7);
      }
      else {
        local_5c = l - 1;
        local_e0 = (local_e0 - local_d0) / (double)(int)local_5c;
        local_8c = m - 1;
        local_78 = (local_78 - local_48) / (double)(int)local_8c;
        local_80 = (REF_NODE)(((double)local_80 - local_50) / (double)(int)uVar2);
        local_88 = (ulong)(uint)(m * l);
        local_58 = 0;
        local_6c = 0;
        local_c0 = uVar7;
        local_b8 = (ulong)(uint)m;
        local_68 = (ulong)uVar2;
        do {
          if (0 < (int)local_b8) {
            local_98 = (double)(int)local_6c * (double)local_80 + local_50;
            iVar21 = 0;
            lVar19 = local_58;
            do {
              if (0 < (int)local_c0) {
                local_c8 = (double)iVar21 * local_78 + local_48;
                uVar16 = 0;
                do {
                  uVar2 = ref_node_add(ref_node,(long)((int)lVar19 + (int)uVar16),&local_34);
                  if (uVar2 != 0) {
                    uVar7 = (ulong)uVar2;
                    pcVar15 = "node";
                    uVar9 = 0x66b;
                    goto LAB_00138b92;
                  }
                  pRVar1 = ref_node->real;
                  lVar8 = (long)local_34;
                  pRVar1[lVar8 * 0xf] = (double)(int)uVar16 * local_e0 + local_d0;
                  pRVar1[lVar8 * 0xf + 1] = local_c8;
                  pRVar1[lVar8 * 0xf + 2] = local_98;
                  uVar16 = uVar16 + 1;
                } while (uVar7 != uVar16);
              }
              iVar21 = iVar21 + 1;
              lVar19 = lVar19 + uVar7;
            } while (iVar21 != (int)local_b8);
          }
          local_6c = local_6c + 1;
          local_58 = local_58 + local_88;
          n = (REF_INT)local_b0;
        } while (local_6c != n);
        uVar16 = local_68;
        uVar20 = local_b8;
        uVar7 = local_c0;
        if (n == 1) goto LAB_00138e0d;
        local_90 = (int)local_b8 + 1;
        uVar2 = (int)local_c0 * local_90;
        local_58._4_4_ = (undefined4)((ulong)local_58 >> 0x20);
        local_58 = CONCAT44(local_58._4_4_,1);
        dVar12 = 0.0;
        dVar10 = (double)(local_88 & 0xffffffff);
        RVar14 = (REF_DBL)(local_c0 & 0xffffffff);
        uVar7 = local_b8;
        uVar16 = local_c0;
        local_80 = ref_node;
        do {
          iVar21 = SUB84(RVar14,0);
          iVar4 = SUB84(dVar10,0);
          iVar22 = SUB84(dVar12,0);
          if (1 < (int)uVar7) {
            local_50 = (double)CONCAT44(local_50._4_4_,1);
            local_c8 = (REF_DBL)(ulong)uVar2;
            local_98 = RVar14;
            local_78 = dVar12;
            local_6c = uVar2;
            local_40 = SUB84(RVar14,0);
            local_3c = SUB84(dVar10,0);
            local_38 = SUB84(dVar12,0);
            do {
              if (1 < (int)uVar16) {
                uVar2 = 0;
                local_48 = dVar10;
                do {
                  local_a8 = SUB84(local_78,0) + uVar2;
                  iVar4 = SUB84(local_78,0) + uVar2 + 1;
                  local_a0 = SUB84(local_98,0) + uVar2;
                  iVar21 = SUB84(local_48,0);
                  iVar22 = iVar21 + uVar2;
                  local_e0 = (double)CONCAT44(local_e0._4_4_,local_a0);
                  local_a4 = iVar4;
                  local_9c = iVar22;
                  uVar3 = ref_cell_add(local_d8->cell[8],&local_a8,&local_fc);
                  if (uVar3 != 0) {
                    uVar7 = (ulong)uVar3;
                    pcVar15 = "tet";
                    uVar9 = 0x683;
                    goto LAB_00138b92;
                  }
                  local_9c = iVar21 + uVar2 + 1;
                  local_a4 = local_e0._0_4_;
                  local_d0 = (double)CONCAT44(local_d0._4_4_,local_9c);
                  local_a8 = iVar4;
                  local_a0 = iVar22;
                  uVar3 = ref_cell_add(local_d8->cell[8],&local_a8,&local_fc);
                  if (uVar3 != 0) {
                    uVar7 = (ulong)uVar3;
                    pcVar15 = "tet";
                    uVar9 = 0x688;
                    goto LAB_00138b92;
                  }
                  iVar21 = SUB84(local_c8,0) + uVar2;
                  local_a8 = local_e0._0_4_;
                  local_a0 = local_d0._0_4_;
                  local_a4 = iVar22;
                  local_9c = iVar21;
                  uVar3 = ref_cell_add(local_d8->cell[8],&local_a8,&local_fc);
                  if (uVar3 != 0) {
                    uVar7 = (ulong)uVar3;
                    pcVar15 = "tet";
                    uVar9 = 0x68d;
                    goto LAB_00138b92;
                  }
                  iVar22 = SUB84(local_98,0) + uVar2 + 1;
                  local_a0 = local_e0._0_4_;
                  local_9c = local_d0._0_4_;
                  local_a8 = iVar4;
                  local_a4 = iVar22;
                  uVar3 = ref_cell_add(local_d8->cell[8],&local_a8,&local_fc);
                  if (uVar3 != 0) {
                    uVar7 = (ulong)uVar3;
                    pcVar15 = "tet";
                    uVar9 = 0x692;
                    goto LAB_00138b92;
                  }
                  local_a4 = local_e0._0_4_;
                  local_a0 = local_d0._0_4_;
                  local_a8 = iVar22;
                  local_9c = iVar21;
                  uVar3 = ref_cell_add(local_d8->cell[8],&local_a8,&local_fc);
                  if (uVar3 != 0) {
                    uVar7 = (ulong)uVar3;
                    pcVar15 = "tet";
                    uVar9 = 0x697;
                    goto LAB_00138b92;
                  }
                  local_9c = SUB84(local_c8,0) + uVar2 + 1;
                  local_a0 = local_d0._0_4_;
                  local_a8 = iVar22;
                  local_a4 = iVar21;
                  uVar3 = ref_cell_add(local_d8->cell[8],&local_a8,&local_fc);
                  if (uVar3 != 0) {
                    uVar7 = (ulong)uVar3;
                    pcVar15 = "tet";
                    uVar9 = 0x69c;
                    goto LAB_00138b92;
                  }
                  uVar2 = uVar2 + 1;
                  dVar10 = local_48;
                } while (local_5c != uVar2);
              }
              iVar5 = local_50._0_4_ + 1;
              iVar21 = (int)local_c0;
              local_c8 = (REF_DBL)(ulong)(uint)(SUB84(local_c8,0) + iVar21);
              local_98 = (REF_DBL)(ulong)(uint)(SUB84(local_98,0) + iVar21);
              dVar10 = (double)(ulong)(uint)(SUB84(dVar10,0) + iVar21);
              local_78 = (double)(ulong)(uint)(SUB84(local_78,0) + iVar21);
              local_50 = (double)CONCAT44(local_50._4_4_,iVar5);
              uVar7 = local_b8;
              uVar16 = local_c0;
              uVar2 = local_6c;
              iVar21 = local_40;
              iVar4 = local_3c;
              iVar22 = local_38;
            } while (iVar5 != (int)local_b8);
          }
          pRVar18 = local_d8;
          uVar3 = (int)local_58 + 1;
          iVar5 = (int)local_88;
          uVar2 = uVar2 + iVar5;
          RVar14 = (REF_DBL)(ulong)(uint)(iVar21 + iVar5);
          dVar10 = (double)(ulong)(uint)(iVar4 + iVar5);
          dVar12 = (double)(ulong)(uint)(iVar22 + iVar5);
          local_58 = CONCAT44(local_58._4_4_,uVar3);
        } while (uVar3 != n);
        local_ec = 1;
        if (n == 1) {
          n = (REF_INT)local_b0;
          uVar16 = local_68;
          ref_node = local_80;
          uVar20 = local_b8;
          uVar7 = local_c0;
        }
        else {
          local_90 = local_90 * (int)local_c0;
          local_98 = (REF_DBL)CONCAT44(local_98._4_4_,1);
          local_c8 = (REF_DBL)((ulong)local_c8 & 0xffffffff00000000);
          do {
            uVar2 = local_8c;
            uVar3 = local_c8._0_4_;
            if (1 < (int)local_b8) {
              do {
                local_d0 = (double)CONCAT44(local_d0._4_4_,uVar2);
                local_f4 = (int)local_c0 + uVar3;
                uVar17 = (int)local_88 + uVar3;
                local_e0 = (double)CONCAT44(local_e0._4_4_,local_f4);
                local_f8 = uVar3;
                local_f0 = uVar17;
                uVar2 = ref_cell_add(pRVar18->cell[3],(REF_INT *)&local_f8,&local_fc);
                if (uVar2 != 0) {
                  uVar7 = (ulong)uVar2;
                  pcVar15 = "qua";
                  uVar9 = 0x6ac;
                  goto LAB_00138b92;
                }
                local_f4 = uVar3 + local_90;
                local_f8 = local_e0._0_4_;
                local_f0 = uVar17;
                uVar2 = ref_cell_add(pRVar18->cell[3],(REF_INT *)&local_f8,&local_fc);
                uVar7 = (ulong)uVar2;
                if (uVar2 != 0) {
                  pcVar15 = "qua";
                  uVar9 = 0x6b0;
                  goto LAB_00138b92;
                }
                uVar2 = local_d0._0_4_ - 1;
                uVar3 = local_e0._0_4_;
              } while (uVar2 != 0);
            }
            iVar21 = local_98._0_4_ + 1;
            local_c8 = (REF_DBL)CONCAT44(local_c8._4_4_,local_c8._0_4_ + (int)local_88);
            local_98 = (REF_DBL)CONCAT44(local_98._4_4_,iVar21);
          } while (iVar21 != (int)local_b0);
          local_ec = 2;
          if ((int)local_b0 == 1) {
            n = 1;
            uVar16 = local_68;
            ref_node = local_80;
            uVar20 = local_b8;
            uVar7 = local_c0;
          }
          else {
            uVar2 = ((int)local_b8 + 2) * (int)local_c0 - 1;
            local_d0 = (double)CONCAT44(local_d0._4_4_,(int)local_c0 * 2 + -1);
            local_90 = local_90 - 1;
            local_c8 = (REF_DBL)CONCAT44(local_c8._4_4_,1);
            do {
              local_e0 = (double)CONCAT44(local_e0._4_4_,local_8c);
              uVar17 = local_5c;
              uVar23 = local_90;
              uVar11 = local_d0._0_4_;
              uVar3 = uVar2;
              if (1 < (int)local_b8) {
                do {
                  local_f8 = uVar11;
                  local_f4 = uVar17;
                  local_f0 = uVar23;
                  uVar6 = ref_cell_add(local_d8->cell[3],(REF_INT *)&local_f8,&local_fc);
                  if (uVar6 != 0) {
                    uVar7 = (ulong)uVar6;
                    pcVar15 = "qua";
                    uVar9 = 0x6c0;
                    goto LAB_00138b92;
                  }
                  local_f8 = uVar11;
                  local_f4 = uVar23;
                  local_f0 = uVar3;
                  uVar6 = ref_cell_add(local_d8->cell[3],(REF_INT *)&local_f8,&local_fc);
                  if (uVar6 != 0) {
                    uVar7 = (ulong)uVar6;
                    pcVar15 = "qua";
                    uVar9 = 0x6c4;
                    goto LAB_00138b92;
                  }
                  iVar21 = (int)local_c0;
                  uVar3 = uVar3 + iVar21;
                  uVar11 = uVar11 + iVar21;
                  uVar23 = uVar23 + iVar21;
                  uVar17 = uVar17 + iVar21;
                  iVar21 = local_e0._0_4_ + -1;
                  local_e0 = (double)CONCAT44(local_e0._4_4_,iVar21);
                } while (iVar21 != 0);
              }
              iVar4 = local_c8._0_4_ + 1;
              iVar21 = (int)local_88;
              uVar2 = uVar2 + iVar21;
              local_d0 = (double)CONCAT44(local_d0._4_4_,local_d0._0_4_ + iVar21);
              local_90 = local_90 + iVar21;
              local_5c = local_5c + iVar21;
              local_c8 = (REF_DBL)CONCAT44(local_c8._4_4_,iVar4);
            } while (iVar4 != (int)local_b0);
            local_ec = 3;
            if ((int)local_b0 == 1) {
              n = 1;
              uVar16 = local_68;
              ref_node = local_80;
              uVar20 = local_b8;
              uVar7 = local_c0;
            }
            else {
              local_c8 = (REF_DBL)CONCAT44(local_c8._4_4_,(int)local_c0 + -1);
              local_e0 = (double)CONCAT44(local_e0._4_4_,1);
              local_d0 = (double)CONCAT44(local_d0._4_4_,iVar21);
              iVar21 = 1;
              do {
                uVar2 = local_e0._0_4_;
                uVar3 = local_d0._0_4_;
                iVar4 = local_c8._0_4_;
                if (1 < (int)local_c0) {
                  do {
                    local_f4 = uVar2 - 1;
                    local_f8 = uVar2;
                    local_f0 = uVar3;
                    uVar17 = ref_cell_add(local_d8->cell[3],(REF_INT *)&local_f8,&local_fc);
                    if (uVar17 != 0) {
                      uVar7 = (ulong)uVar17;
                      pcVar15 = "qua";
                      uVar9 = 0x6d4;
                      goto LAB_00138b92;
                    }
                    local_f8 = uVar2;
                    local_f4 = uVar3;
                    local_f0 = uVar3 + 1;
                    uVar17 = ref_cell_add(local_d8->cell[3],(REF_INT *)&local_f8,&local_fc);
                    if (uVar17 != 0) {
                      uVar7 = (ulong)uVar17;
                      pcVar15 = "qua";
                      uVar9 = 0x6d8;
                      goto LAB_00138b92;
                    }
                    uVar2 = uVar2 + 1;
                    iVar4 = iVar4 + -1;
                    uVar3 = uVar3 + 1;
                  } while (iVar4 != 0);
                }
                iVar21 = iVar21 + 1;
                local_d0 = (double)CONCAT44(local_d0._4_4_,local_d0._0_4_ + (int)local_88);
                local_e0 = (double)CONCAT44(local_e0._4_4_,local_e0._0_4_ + (int)local_88);
              } while (iVar21 != (int)local_b0);
              local_ec = 4;
              if ((int)local_b0 != 1) {
                iVar21 = (int)local_c0;
                local_8c = local_8c * iVar21;
                local_d0 = (double)CONCAT44(local_d0._4_4_,iVar21 + -1);
                uVar2 = ((int)local_b8 * 2 + -1) * iVar21;
                local_e0 = (double)CONCAT44(local_e0._4_4_,1);
                do {
                  uVar17 = local_8c;
                  iVar21 = local_d0._0_4_;
                  uVar3 = uVar2;
                  if (1 < (int)local_c0) {
                    do {
                      uVar23 = uVar17 + 1;
                      local_f8 = uVar17;
                      local_f4 = uVar23;
                      local_f0 = uVar3;
                      uVar17 = ref_cell_add(local_d8->cell[3],(REF_INT *)&local_f8,&local_fc);
                      if (uVar17 != 0) {
                        uVar7 = (ulong)uVar17;
                        pcVar15 = "qua";
                        uVar9 = 0x6e8;
                        goto LAB_00138b92;
                      }
                      local_f8 = uVar23;
                      local_f4 = uVar3 + 1;
                      local_f0 = uVar3;
                      uVar17 = ref_cell_add(local_d8->cell[3],(REF_INT *)&local_f8,&local_fc);
                      if (uVar17 != 0) {
                        uVar7 = (ulong)uVar17;
                        pcVar15 = "qua";
                        uVar9 = 0x6ec;
                        goto LAB_00138b92;
                      }
                      iVar21 = iVar21 + -1;
                      uVar17 = uVar23;
                      uVar3 = uVar3 + 1;
                    } while (iVar21 != 0);
                  }
                  iVar21 = local_e0._0_4_ + 1;
                  uVar2 = uVar2 + (int)local_88;
                  local_8c = local_8c + (int)local_88;
                  local_e0 = (double)CONCAT44(local_e0._4_4_,iVar21);
                } while (iVar21 != (int)local_b0);
              }
              n = (REF_INT)local_b0;
              uVar16 = local_68;
              ref_node = local_80;
              uVar20 = local_b8;
              uVar7 = local_c0;
            }
          }
        }
      }
      local_ec = 5;
      if ((int)uVar20 < 2) {
        local_ec = 6;
      }
      else {
        iVar21 = (int)uVar7 + -1;
        uVar2 = 1;
        uVar13 = uVar7 & 0xffffffff;
        iVar4 = 1;
        local_78 = (double)CONCAT44(local_78._4_4_,iVar21);
        pRVar18 = local_d8;
        local_c0 = uVar7;
        local_b8 = uVar20;
        local_80 = ref_node;
        local_68 = uVar16;
        do {
          local_98 = (REF_DBL)CONCAT44(local_98._4_4_,iVar4);
          local_d0 = (double)CONCAT44(local_d0._4_4_,uVar2);
          local_c8 = (REF_DBL)CONCAT44(local_c8._4_4_,(int)uVar13);
          if (1 < (int)local_c0) {
            do {
              local_e0 = (double)CONCAT44(local_e0._4_4_,iVar21);
              local_f8 = uVar2 - 1;
              uVar17 = (uint)uVar13;
              local_f4 = uVar2;
              local_f0 = uVar17;
              uVar3 = ref_cell_add(pRVar18->cell[3],(REF_INT *)&local_f8,&local_fc);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar15 = "qua";
                uVar9 = 0x6fc;
                goto LAB_00138b95;
              }
              local_f8 = uVar2;
              local_f4 = uVar17 + 1;
              local_f0 = uVar17;
              uVar3 = ref_cell_add(pRVar18->cell[3],(REF_INT *)&local_f8,&local_fc);
              uVar7 = (ulong)uVar3;
              if (uVar3 != 0) {
                pcVar15 = "qua";
                uVar9 = 0x700;
                goto LAB_00138b92;
              }
              uVar2 = uVar2 + 1;
              uVar13 = (ulong)(uVar17 + 1);
              iVar21 = local_e0._0_4_ + -1;
              pRVar18 = local_d8;
            } while (iVar21 != 0);
          }
          iVar4 = local_98._0_4_ + 1;
          iVar22 = (int)local_c0;
          uVar13 = (ulong)(local_c8._0_4_ + iVar22);
          uVar2 = local_d0._0_4_ + iVar22;
          iVar21 = local_78._0_4_;
        } while (iVar4 != (int)local_b8);
        local_ec = 6;
        n = (REF_INT)local_b0;
        ref_node = local_80;
        if (1 < (int)local_b8) {
          uVar3 = (int)local_68 * (int)local_88;
          local_78 = (double)CONCAT44(local_78._4_4_,iVar22 + -1);
          uVar2 = iVar22 + uVar3;
          local_c8 = (REF_DBL)CONCAT44(local_c8._4_4_,1);
          do {
            uVar7 = (ulong)uVar3;
            local_98 = (REF_DBL)CONCAT44(local_98._4_4_,uVar2);
            iVar21 = local_78._0_4_;
            local_68 = uVar7;
            if (1 < (int)local_c0) {
              do {
                local_e0 = (double)CONCAT44(local_e0._4_4_,iVar21);
                local_f4 = (uint)uVar7;
                uVar17 = local_f4 + 1;
                local_f8 = uVar17;
                local_f0 = uVar2;
                uVar3 = ref_cell_add(local_d8->cell[3],(REF_INT *)&local_f8,&local_fc);
                if (uVar3 != 0) {
                  uVar7 = (ulong)uVar3;
                  pcVar15 = "qua";
                  uVar9 = 0x710;
                  goto LAB_00138b92;
                }
                local_d0 = (double)CONCAT44(local_d0._4_4_,uVar17);
                local_f8 = uVar17;
                local_f4 = uVar2;
                local_f0 = uVar2 + 1;
                uVar3 = ref_cell_add(local_d8->cell[3],(REF_INT *)&local_f8,&local_fc);
                uVar7 = (ulong)uVar3;
                if (uVar3 != 0) {
                  pcVar15 = "qua";
                  uVar9 = 0x714;
                  goto LAB_00138b92;
                }
                iVar21 = local_e0._0_4_ + -1;
                uVar7 = (ulong)local_d0 & 0xffffffff;
                uVar2 = uVar2 + 1;
              } while (iVar21 != 0);
            }
            iVar21 = local_c8._0_4_ + 1;
            uVar2 = local_98._0_4_ + (int)local_c0;
            uVar3 = (int)local_68 + (int)local_c0;
            local_c8 = (REF_DBL)CONCAT44(local_c8._4_4_,iVar21);
            ref_node = local_80;
          } while (iVar21 != (int)local_b8);
        }
      }
      uVar2 = ref_node_initialize_n_global(ref_node,(long)((int)local_88 * n));
      if (uVar2 != 0) {
        uVar7 = (ulong)uVar2;
        pcVar15 = "init glob";
        uVar9 = 0x717;
        goto LAB_00138b92;
      }
    }
    else {
      uVar2 = ref_node_initialize_n_global(ref_node,(long)(m * l * n));
      if (uVar2 != 0) {
        uVar7 = (ulong)uVar2;
        pcVar15 = "init glob";
        uVar9 = 0x661;
        goto LAB_00138b92;
      }
    }
    uVar3 = 0;
  }
  else {
    uVar7 = (ulong)uVar2;
    pcVar15 = "create";
    uVar9 = 0x65c;
LAB_00138b92:
    uVar3 = (uint)uVar7;
LAB_00138b95:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar9
           ,"ref_fixture_tet_brick_args_grid",uVar7,pcVar15);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tet_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], tet[4], cell;
  REF_INT quad[5], tri[4];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        tet[0] = hex[0];
        tet[1] = hex[1];
        tet[2] = hex[3];
        tet[3] = hex[4];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[1];
        tet[1] = hex[3];
        tet[2] = hex[4];
        tet[3] = hex[5];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[3];
        tet[1] = hex[4];
        tet[2] = hex[5];
        tet[3] = hex[7];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[1];
        tet[1] = hex[2];
        tet[2] = hex[3];
        tet[3] = hex[5];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[2];
        tet[1] = hex[3];
        tet[2] = hex[5];
        tet[3] = hex[7];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[2];
        tet[1] = hex[7];
        tet[2] = hex[5];
        tet[3] = hex[6];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
      }

  quad[4] = 1;
  tri[3] = quad[4];
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 2;
  tri[3] = quad[4];
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 3;
  tri[3] = quad[4];
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 4;
  tri[3] = quad[4];
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 5;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 6;
  tri[3] = quad[4];
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}